

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WithDelete(sqlite3 *db,With *pWith)

{
  Cte *pCVar1;
  Cte *pCte;
  int i;
  With *pWith_local;
  sqlite3 *db_local;
  
  if (pWith != (With *)0x0) {
    for (pCte._4_4_ = 0; pCte._4_4_ < pWith->nCte; pCte._4_4_ = pCte._4_4_ + 1) {
      pCVar1 = pWith->a + pCte._4_4_;
      sqlite3ExprListDelete(db,pCVar1->pCols);
      sqlite3SelectDelete(db,pCVar1->pSelect);
      sqlite3DbFree(db,pCVar1->zName);
    }
    sqlite3DbFree(db,pWith);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WithDelete(sqlite3 *db, With *pWith){
  if( pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      struct Cte *pCte = &pWith->a[i];
      sqlite3ExprListDelete(db, pCte->pCols);
      sqlite3SelectDelete(db, pCte->pSelect);
      sqlite3DbFree(db, pCte->zName);
    }
    sqlite3DbFree(db, pWith);
  }
}